

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

int xmlSwitchEncoding(xmlParserCtxtPtr ctxt,xmlCharEncoding enc)

{
  int *piVar1;
  xmlParserErrors code;
  int iVar2;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandler *local_20;
  
  local_20 = (xmlCharEncodingHandlerPtr)0x0;
  iVar2 = -1;
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
    code = xmlLookupCharEncodingHandler(enc,&local_20);
    if (code == XML_ERR_OK) {
      iVar2 = xmlSwitchToEncoding(ctxt,local_20);
      if (enc == XML_CHAR_ENCODING_NONE && -1 < iVar2) {
        piVar1 = &ctxt->input->flags;
        *piVar1 = *piVar1 & 0xfffffffe;
        iVar2 = 0;
      }
    }
    else {
      xmlFatalErr(ctxt,code,(char *)0x0);
    }
  }
  return iVar2;
}

Assistant:

int
xmlSwitchEncoding(xmlParserCtxtPtr ctxt, xmlCharEncoding enc)
{
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;
    xmlParserErrors code;

    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    code = xmlLookupCharEncodingHandler(enc, &handler);
    if (code != 0) {
        xmlFatalErr(ctxt, code, NULL);
        return(-1);
    }

    ret = xmlSwitchToEncoding(ctxt, handler);

    if ((ret >= 0) && (enc == XML_CHAR_ENCODING_NONE)) {
        ctxt->input->flags &= ~XML_INPUT_HAS_ENCODING;
    }

    return(ret);
}